

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

size_t __thiscall TxaHeader::updateAndCalcBinSize(TxaHeader *this)

{
  bool bVar1;
  long lVar2;
  byte *in_RDI;
  TxaChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  size_t chunksize;
  size_t size;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *in_stack_ffffffffffffff78;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
  *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_58 [4];
  reference local_38;
  TxaChunk *local_30;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_28;
  byte *local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = 0x20;
  local_18 = 0x10;
  if ((*in_RDI & 1) != 0) {
    local_18 = 0x14;
  }
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  local_20 = in_RDI + 0x18;
  local_28._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin(in_stack_ffffffffffffff78);
  local_30 = (TxaChunk *)
             std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end(in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff80,
                            (__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
               operator*(&local_28);
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + (int)local_18;
    in_stack_ffffffffffffff80 = local_58;
    fromUTF8(in_stack_ffffffffffffff88);
    lVar2 = std::__cxx11::string::size();
    in_stack_ffffffffffffff88 = (string *)align(lVar2 + 1,4);
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + (int)in_stack_ffffffffffffff88;
    std::__cxx11::string::~string((string *)local_58);
    if (*(uint *)(in_RDI + 0xc) < local_38->decodedLength) {
      *(uint32_t *)(in_RDI + 0xc) = local_38->decodedLength;
    }
    __gnu_cxx::__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_28);
  }
  return local_10 + (ulong)*(uint *)(in_RDI + 0x10);
}

Assistant:

size_t TxaHeader::updateAndCalcBinSize() {
	size_t size = isSwitch ? sizeof(TxaHeaderSwitch) : sizeof(TxaHeaderPS3);
	size_t chunksize = isSwitch ? sizeof(TxaChunkSwitch) : sizeof(TxaChunkPS3);
	indexSize = 0;
	largestDecodedChunk = 0;

	for (const auto& chunk : chunks) {
		indexSize += chunksize;
		indexSize += align(fromUTF8(chunk.name).size() + 1, 4);
		if (chunk.decodedLength > largestDecodedChunk) {
			largestDecodedChunk = chunk.decodedLength;
		}
	}

	return size + indexSize;
}